

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_send2cluster(fio_msg_internal_s *m)

{
  fio_ls_s **ppfVar1;
  uintptr_t *puVar2;
  uint8_t uVar3;
  void *uuid;
  fio_write_args_s options;
  fio_lock_i fVar4;
  size_t sVar5;
  fio_ls_s *pfVar6;
  timespec tStack_78;
  size_t sStack_68;
  char *pcStack_60;
  ulong uStack_58;
  size_t sStack_50;
  char *pcStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined1 uStack_30;
  
  if ((fio_data == (fio_data_s *)0x0) || (fio_data->active == '\0')) {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: facio.io cluster inactive, can\'t send message.");
      return;
    }
  }
  else if (fio_data->workers != 1) {
    uVar3 = fio_data->is_worker;
    LOCK();
    m->ref = m->ref + 1;
    UNLOCK();
    if (uVar3 == '\0') {
      LOCK();
      UNLOCK();
      tStack_78.tv_sec = CONCAT71(tStack_78.tv_sec._1_7_,cluster_data.lock);
      if (cluster_data.lock != '\0') {
        do {
          cluster_data.lock = '\x01';
          tStack_78.tv_sec = 0;
          tStack_78.tv_nsec = 1;
          nanosleep(&tStack_78,(timespec *)0x0);
          LOCK();
          UNLOCK();
          tStack_78.tv_sec = CONCAT71(tStack_78.tv_sec._1_7_,cluster_data.lock);
        } while (cluster_data.lock != '\0');
      }
      cluster_data.lock = '\x01';
      pfVar6 = cluster_data.clients.next;
      if (cluster_data.clients.next != &cluster_data.clients) {
        do {
          uuid = pfVar6->obj;
          if (uuid != (void *)0xffffffffffffffff) {
            LOCK();
            m->ref = m->ref + 1;
            UNLOCK();
            tStack_78.tv_nsec = (long)fio_msg_internal_free2;
            sStack_68 = (m->data).len + 0x12 + (m->channel).len;
            pcStack_60 = (char *)(m->meta_len * 0x18 + 0x48);
            uStack_58 = uStack_58 & 0xfffffffffffffff0;
            options.after.dealloc = fio_msg_internal_free2;
            options.data.buffer = m;
            options.length = sStack_68;
            options.offset = (uintptr_t)pcStack_60;
            options._32_8_ = uStack_58;
            tStack_78.tv_sec = (__time_t)m;
            fio_write2_fn((intptr_t)uuid,options);
          }
          ppfVar1 = &pfVar6->next;
          pfVar6 = *ppfVar1;
        } while (*ppfVar1 != &cluster_data.clients);
      }
      fVar4 = cluster_data.lock;
      LOCK();
      cluster_data.lock = '\0';
      UNLOCK();
      tStack_78.tv_sec = CONCAT71(tStack_78.tv_sec._1_7_,fVar4);
      LOCK();
      puVar2 = &m->ref;
      *puVar2 = *puVar2 - 1;
      UNLOCK();
      if (*puVar2 == 0) {
        sVar5 = m->meta_len;
        if (sVar5 != 0) {
          do {
            m->meta_len = sVar5 - 1;
            if (*(long *)(&m->filter + sVar5 * 6) != 0) {
              tStack_78.tv_sec = tStack_78.tv_sec & 0xffffffff00000000;
              pcStack_60 = (m->channel).data;
              tStack_78.tv_nsec = (m->channel).capa;
              sStack_68 = (m->channel).len;
              pcStack_48 = (m->data).data;
              uStack_58 = (m->data).capa;
              sStack_50 = (m->data).len;
              uStack_40 = 0;
              uStack_38 = 0;
              uStack_30 = 0;
              (**(code **)(&m->filter + sVar5 * 6))(&tStack_78,(&m->meta_len)[sVar5 * 3]);
            }
            sVar5 = m->meta_len;
          } while (sVar5 != 0);
        }
        fio_free(m);
      }
      return;
    }
    fio_cluster_client_sender(m,-1);
    return;
  }
  return;
}

Assistant:

static void fio_send2cluster(fio_msg_internal_s *m) {
  if (!fio_is_running()) {
    FIO_LOG_ERROR("facio.io cluster inactive, can't send message.");
    return;
  }
  if (fio_data->workers == 1) {
    /* nowhere to send to */
    return;
  }
  if (fio_is_master()) {
    fio_cluster_server_sender(fio_msg_internal_dup(m), -1);
  } else {
    fio_cluster_client_sender(fio_msg_internal_dup(m), -1);
  }
}